

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O3

uint prvTidytmbstrlen(ctmbstr str)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  if ((str != (ctmbstr)0x0) && (*str != '\0')) {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (str[lVar1] != '\0');
  }
  return (uint)lVar2;
}

Assistant:

uint TY_(tmbstrlen)( ctmbstr str )
{
    uint len = 0;
    if ( str ) 
    {
        while ( *str++ )
            ++len;
    }
    return len;
}